

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O2

void lsp::LanguageService::toClient_request_workspace_workspaceFolders(void)

{
  element_type *this;
  uint32_t id_00;
  allocator<char> local_199;
  undefined1 local_198 [32];
  json paramsjson;
  Id id;
  code *local_138 [2];
  code *local_128;
  code *local_120;
  Parameter local_118;
  Request request;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&paramsjson,(nullptr_t)0x0);
  id_00 = getNextRequestID::id;
  getNextRequestID::id = getNextRequestID::id + 1;
  jsonrpcpp::Id::Id(&id,id_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"workspace/workspaceFolders",&local_199);
  jsonrpcpp::Parameter::Parameter(&local_118,&paramsjson);
  jsonrpcpp::Request::Request(&request,&id,(string *)local_198,&local_118);
  jsonrpcpp::Parameter::~Parameter(&local_118);
  std::__cxx11::string::~string((string *)local_198);
  this = ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  jsonrpcpp::Request::to_json_abi_cxx11_((Request *)local_198);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump((string_t *)&local_118,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)local_198,-1,' ',false,strict);
  IOHandler::addMessageToSend(this,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_198);
  local_138[1] = (code *)0x0;
  local_138[0] = response_workspace_workspaceFolders;
  local_120 = std::
              _Function_handler<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&),_void_(*)(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&),_void_(*)(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
              ::_M_manager;
  MessageParser::register_response_callback
            (messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,id.super_Entity._12_4_,(response_callback *)local_138);
  std::_Function_base::~_Function_base((_Function_base *)local_138);
  jsonrpcpp::Request::~Request(&request);
  jsonrpcpp::Id::~Id(&id);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&paramsjson);
  return;
}

Assistant:

void lsp::LanguageService::toClient_request_workspace_workspaceFolders()
{
    json paramsjson = nullptr;
    jsonrpcpp::Id id(getNextRequestID());
    jsonrpcpp::Request request(id, "workspace/workspaceFolders", paramsjson);
    ioHandler_->addMessageToSend(request.to_json().dump());
    messageParser_->register_response_callback(id.int_id(), response_workspace_workspaceFolders);
}